

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O1

uint64 __thiscall
dlib::thread_pool_implementation::make_next_task_id(thread_pool_implementation *this,long idx)

{
  task_state_type *ptVar1;
  uint64 uVar2;
  size_t sVar3;
  
  ptVar1 = (this->tasks).array_elements;
  uVar2 = ptVar1[idx].next_task_id;
  sVar3 = (this->tasks).array_size;
  ptVar1[idx].next_task_id = uVar2 + 1;
  return sVar3 * uVar2 + idx;
}

Assistant:

T& array<T,mem_manager>::
    operator[] (
        size_t pos
    ) 
    {
        // make sure requires clause is not broken
        DLIB_ASSERT( pos < this->size() , 
            "\tT& array::operator[]"
            << "\n\tpos must be < size()" 
            << "\n\tpos: " << pos 
            << "\n\tsize(): " << this->size()
            << "\n\tthis: " << this
            );

        return array_elements[pos];
    }